

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlWriter::writeEncodedText(XmlWriter *this,string *text)

{
  char cVar1;
  pointer pcVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  string mtext;
  char *local_70;
  long local_68;
  char local_60 [16];
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_70 = local_60;
  pcVar2 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + text->_M_string_length);
  pcVar5 = writeEncodedText::charsToEncode;
  strlen(writeEncodedText::charsToEncode);
  lVar4 = std::__cxx11::string::find_first_of((char *)&local_70,(ulong)pcVar5,0);
  if (lVar4 != -1) {
    do {
      poVar3 = this->m_os;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      cVar1 = local_70[lVar4];
      if (cVar1 == '\"') {
        lVar4 = 6;
        pcVar5 = "&quot;";
LAB_0014ce29:
        std::__ostream_insert<char,std::char_traits<char>>(this->m_os,pcVar5,lVar4);
      }
      else {
        if (cVar1 == '&') {
          lVar4 = 5;
          pcVar5 = "&amp;";
          goto LAB_0014ce29;
        }
        if (cVar1 == '<') {
          lVar4 = 4;
          pcVar5 = "&lt;";
          goto LAB_0014ce29;
        }
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      pcVar5 = writeEncodedText::charsToEncode;
      strlen(writeEncodedText::charsToEncode);
      lVar4 = std::__cxx11::string::find_first_of((char *)&local_70,(ulong)pcVar5,0);
    } while (lVar4 != -1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->m_os,local_70,local_68);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void writeEncodedText( std::string const& text ) {
            static const char* charsToEncode = "<&\"";
            std::string mtext = text;
            std::string::size_type pos = mtext.find_first_of( charsToEncode );
            while( pos != std::string::npos ) {
                stream() << mtext.substr( 0, pos );

                switch( mtext[pos] ) {
                    case '<':
                        stream() << "&lt;";
                        break;
                    case '&':
                        stream() << "&amp;";
                        break;
                    case '\"':
                        stream() << "&quot;";
                        break;
                }
                mtext = mtext.substr( pos+1 );
                pos = mtext.find_first_of( charsToEncode );
            }
            stream() << mtext;
        }